

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O1

sg_image sg_make_image(sg_image_desc *desc)

{
  sg_image sVar1;
  _sg_image_t *img;
  uint32_t img_id;
  sg_image_desc desc_def;
  sg_image_desc sStack_6a8;
  
  if (!_sg.valid) {
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_gfx.h"
                  ,0x3f15,"sg_image sg_make_image(const sg_image_desc *)");
  }
  if (desc != (sg_image_desc *)0x0) {
    _sg_image_desc_defaults(&sStack_6a8,desc);
    img_id = (uint32_t)desc;
    sVar1 = _sg_alloc_image();
    if (sVar1.id == 0) {
      if (_sg.desc.logger.log_cb == (_func_void_char_ptr_void_ptr *)0x0) {
        puts("image pool exhausted!");
      }
      else {
        (*_sg.desc.logger.log_cb)("image pool exhausted!",_sg.desc.logger.user_data);
      }
    }
    else {
      img = _sg_image_at((_sg_pools_t *)(ulong)sVar1.id,img_id);
      if ((img == (_sg_image_t *)0x0) || ((img->slot).state != SG_RESOURCESTATE_ALLOC)) {
        __assert_fail("img && (img->slot.state == SG_RESOURCESTATE_ALLOC)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_gfx.h"
                      ,0x3f1b,"sg_image sg_make_image(const sg_image_desc *)");
      }
      _sg_init_image(img,&sStack_6a8);
      if (((img->slot).state & ~SG_RESOURCESTATE_ALLOC) != SG_RESOURCESTATE_VALID) {
        __assert_fail("(img->slot.state == SG_RESOURCESTATE_VALID) || (img->slot.state == SG_RESOURCESTATE_FAILED)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_gfx.h"
                      ,0x3f1d,"sg_image sg_make_image(const sg_image_desc *)");
      }
    }
    return (sg_image)sVar1.id;
  }
  __assert_fail("desc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_gfx.h"
                ,0x3f16,"sg_image sg_make_image(const sg_image_desc *)");
}

Assistant:

inline sg_image sg_make_image(const sg_image_desc& desc) { return sg_make_image(&desc); }